

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.cpp
# Opt level: O0

bool __thiscall spvtools::opt::IRContext::RemoveCapability(IRContext *this,Capability capability)

{
  bool bVar1;
  pointer this_00;
  anon_class_4_1_6ec26ed6 local_4c;
  function<bool_(spvtools::opt::Instruction_*)> local_48;
  undefined1 local_28 [8];
  undefined1 local_20 [19];
  bool removed;
  Capability capability_local;
  IRContext *this_local;
  
  local_20._12_4_ = capability;
  unique0x10000123 = this;
  module(this);
  Module::capability_begin((Module *)local_20);
  module(this);
  Module::capability_end((Module *)local_28);
  local_4c.capability = local_20._12_4_;
  std::function<bool(spvtools::opt::Instruction*)>::
  function<spvtools::opt::IRContext::RemoveCapability(spv::Capability)::__0,void>
            ((function<bool(spvtools::opt::Instruction*)> *)&local_48,&local_4c);
  bVar1 = KillInstructionIf(this,(inst_iterator *)local_20,(inst_iterator *)local_28,&local_48);
  std::function<bool_(spvtools::opt::Instruction_*)>::~function(&local_48);
  local_20[0xb] = bVar1;
  if ((bVar1) && (bVar1 = std::operator!=(&this->feature_mgr_,(nullptr_t)0x0), bVar1)) {
    this_00 = std::
              unique_ptr<spvtools::opt::FeatureManager,_std::default_delete<spvtools::opt::FeatureManager>_>
              ::operator->(&this->feature_mgr_);
    FeatureManager::RemoveCapability(this_00,local_20._12_4_);
  }
  return (bool)(local_20[0xb] & 1);
}

Assistant:

bool IRContext::RemoveCapability(spv::Capability capability) {
  const bool removed = KillInstructionIf(
      module()->capability_begin(), module()->capability_end(),
      [capability](Instruction* inst) {
        return static_cast<spv::Capability>(inst->GetSingleWordOperand(0)) ==
               capability;
      });

  if (removed && feature_mgr_ != nullptr) {
    feature_mgr_->RemoveCapability(capability);
  }

  return removed;
}